

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

int Dtt_ComposeNP(int NP1,int NP2)

{
  undefined4 local_18;
  undefined4 local_14;
  int i;
  int NP;
  int NP2_local;
  int NP1_local;
  
  local_14 = 0;
  i = NP2;
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    local_14 = ((NP1 >> (sbyte)((i & 7U) << 2) ^ i) & 8U) << ((byte)(local_18 << 2) & 0x1f) |
               (NP1 >> (sbyte)((i & 7U) << 2) & 7U) << ((byte)(local_18 << 2) & 0x1f) | local_14;
    i = i >> 4;
  }
  return local_14;
}

Assistant:

int Dtt_ComposeNP( int NP1, int NP2 )
{
    // NP[i] = NP1[NP2[i]]
    int NP = 0, i;
    for ( i = 0; i < 5; i++ )
    {
        NP |= ( ( NP1 >> ((NP2&0x7)<<2) ) & 0x7 ) << (i<<2); // P'[i] = P1[P2[i]]
        NP |= ( ( NP1 >> ((NP2&0x7)<<2) ^ NP2 ) & 0x8 ) << (i<<2); // N'[i] = N1[P2[i]] ^ N2[i]
        NP2 = NP2 >> 4;
    }
    return NP; 
}